

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::indexCurve(Earcut<unsigned_int> *this,Node *start)

{
  Node *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  Node *p;
  int32_t local_24;
  Node *local_18;
  
  local_18 = in_RSI;
  do {
    if (local_18->z == 0) {
      local_24 = zOrder(in_RDI,local_18->x,local_18->y);
    }
    else {
      local_24 = local_18->z;
    }
    local_18->z = local_24;
    local_18->prevZ = local_18->prev;
    local_18->nextZ = local_18->next;
    local_18 = local_18->next;
  } while (local_18 != in_RSI);
  local_18->prevZ->nextZ = (Node *)0x0;
  local_18->prevZ = (Node *)0x0;
  sortLinked(in_RDI,local_18);
  return;
}

Assistant:

void Earcut<N>::indexCurve(Node* start) {
    assert(start);
    Node* p = start;

    do {
        p->z = p->z ? p->z : zOrder(p->x, p->y);
        p->prevZ = p->prev;
        p->nextZ = p->next;
        p = p->next;
    } while (p != start);

    p->prevZ->nextZ = nullptr;
    p->prevZ = nullptr;

    sortLinked(p);
}